

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Promise<unsigned_long> __thiscall kj::anon_unknown_123::AsyncPump::pump(AsyncPump *this)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  ulong uVar3;
  void *pvVar4;
  PromiseArena *in_RSI;
  ulong uVar5;
  TransformPromiseNodeBase *this_00;
  OwnPromiseNode local_58;
  OwnPromiseNode local_50;
  AsyncInputStream *local_48;
  SourceLocation local_40;
  
  local_40.fileName = *(char **)(in_RSI->bytes + 0x18);
  uVar3 = *(long *)(in_RSI->bytes + 0x10) - (long)local_40.fileName;
  if (uVar3 == 0) {
    kj::_::PromiseDisposer::
    alloc<kj::_::ImmediatePromiseNode<unsigned_long>,kj::_::PromiseDisposer,unsigned_long>
              ((PromiseDisposer *)&local_48,(unsigned_long *)&local_40);
    this->input = local_48;
  }
  else {
    uVar5 = 0x1000;
    if (uVar3 < 0x1000) {
      uVar5 = uVar3;
    }
    (**(code **)(**(long **)in_RSI->bytes + 8))
              (&local_58,*(long **)in_RSI->bytes,in_RSI->bytes + 0x20,1,uVar5);
    OVar2.ptr = local_58.ptr;
    pPVar1 = ((local_58.ptr)->super_PromiseArenaMember).arena;
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_58.ptr - (long)pPVar1) < 0x28) {
      pvVar4 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3d8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_58,
                 kj::_::
                 SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:116:15)>
                 ::anon_class_8_1_8991fb9c_for_func::operator());
      *(undefined ***)((long)pvVar4 + 0x3d8) = &PTR_destroy_0070a1e8;
      *(PromiseArena **)((long)pvVar4 + 0x3f8) = in_RSI;
      *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
    }
    else {
      ((local_58.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
      this_00 = (TransformPromiseNodeBase *)&local_58.ptr[-3].super_PromiseArenaMember.arena;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_58,
                 kj::_::
                 SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:116:15)>
                 ::anon_class_8_1_8991fb9c_for_func::operator());
      OVar2.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_0070a1e8;
      OVar2.ptr[-1].super_PromiseArenaMember.arena = in_RSI;
      OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
    }
    local_40.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
    ;
    local_40.function = "then";
    local_40.lineNumber = 0x58b;
    local_40.columnNumber = 0x4c;
    local_50.ptr = &this_00->super_PromiseNode;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)&local_48,&local_50,&local_40);
    OVar2.ptr = local_50.ptr;
    this->input = local_48;
    if ((TransformPromiseNodeBase *)local_50.ptr != (TransformPromiseNodeBase *)0x0) {
      local_50.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
    }
    OVar2.ptr = local_58.ptr;
    if (&(local_58.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_58.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<uint64_t> pump() {
    // TODO(perf): This could be more efficient by reading half a buffer at a time and then
    //   starting the next read concurrent with writing the data from the previous read.

    uint64_t n = kj::min(limit - doneSoFar, sizeof(buffer));
    if (n == 0) return doneSoFar;

    return input.tryRead(buffer, 1, n)
        .then([this](size_t amount) -> Promise<uint64_t> {
      if (amount == 0) return doneSoFar;  // EOF
      doneSoFar += amount;
      return output.write(arrayPtr(buffer).first(amount)).then([this]() {
        return pump();
      });
    });
  }